

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_astore(ExecutionEngine *this)

{
  u2 uVar1;
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar2;
  Value variableValue;
  ushort local_3c;
  u1 byte2;
  int16_t index;
  u1 byte1;
  u1 *code;
  Value value;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  variableValue = Frame::popTopOfOperandStack(this_01);
  code._4_4_ = variableValue.type;
  if (code._4_4_ != REFERENCE) {
    __assert_fail("value.type == ValueType::REFERENCE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x4f2,"void ExecutionEngine::i_astore()");
  }
  puVar2 = Frame::getCode(this_01,this_01->pc);
  local_3c = (ushort)puVar2[1];
  if ((this->_isWide & 1U) == 0) {
    this_01->pc = this_01->pc + 2;
  }
  else {
    local_3c = CONCAT11(puVar2[1],puVar2[2]);
    this_01->pc = this_01->pc + 3;
    this->_isWide = false;
  }
  uVar1 = Frame::sizeLocalVariables(this_01);
  if ((short)local_3c < (short)uVar1) {
    Frame::changeLocalVariable(this_01,variableValue,(int)(short)local_3c);
    return;
  }
  __assert_fail("((int16_t)(topFrame->sizeLocalVariables()) > index)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x501,"void ExecutionEngine::i_astore()");
}

Assistant:

void ExecutionEngine::i_astore() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	Value value = topFrame->popTopOfOperandStack();
	assert(value.type == ValueType::REFERENCE);

	u1 *code = topFrame->getCode(topFrame->pc);
	u1 byte1 = code[1]; //índice do vetor de variáveis locais
	int16_t index = (int16_t)byte1;

	if (_isWide) {
		u1 byte2 = code[2];
		index = (byte1 << 8) | byte2;
		topFrame->pc += 3;
		_isWide = false;
	} else {
		topFrame->pc += 2;
	}

	assert(((int16_t)(topFrame->sizeLocalVariables()) > index));
	topFrame->changeLocalVariable(value, index);
}